

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

void amqp_e32(uint32_t val,void *data)

{
  int iVar1;
  uint *in_RSI;
  uint in_EDI;
  undefined4 local_4;
  
  iVar1 = is_bigendian();
  local_4 = in_EDI;
  if (iVar1 == 0) {
    local_4 = in_EDI >> 0x18 | (in_EDI & 0xff0000) >> 8 | (in_EDI & 0xff00) << 8 | in_EDI << 0x18;
  }
  *in_RSI = local_4;
  return;
}

Assistant:

static inline void amqp_e32(uint32_t val, void *data) {
  if (!is_bigendian()) {
    val = ((val & 0xFF000000u) >> 24u) | ((val & 0x00FF0000u) >> 8u) |
          ((val & 0x0000FF00u) << 8u) | ((val & 0x000000FFu) << 24u);
  }
  memcpy(data, &val, sizeof(val));
}